

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_part(REF_EDGE ref_edge,REF_INT edge,REF_INT *part)

{
  REF_NODE pRVar1;
  long local_40;
  long local_30;
  REF_NODE ref_node;
  REF_INT *part_local;
  REF_INT edge_local;
  REF_EDGE ref_edge_local;
  
  pRVar1 = ref_edge->node;
  if (((ref_edge->e2n[edge << 1] < 0) || (pRVar1->max <= ref_edge->e2n[edge << 1])) ||
     (pRVar1->global[ref_edge->e2n[edge << 1]] < 0)) {
    local_30 = -1;
  }
  else {
    local_30 = pRVar1->global[ref_edge->e2n[edge << 1]];
  }
  if (((ref_edge->e2n[edge * 2 + 1] < 0) || (pRVar1->max <= ref_edge->e2n[edge * 2 + 1])) ||
     (pRVar1->global[ref_edge->e2n[edge * 2 + 1]] < 0)) {
    local_40 = -1;
  }
  else {
    local_40 = pRVar1->global[ref_edge->e2n[edge * 2 + 1]];
  }
  if (local_30 < local_40) {
    *part = pRVar1->part[ref_edge->e2n[edge << 1]];
  }
  else {
    *part = pRVar1->part[ref_edge->e2n[edge * 2 + 1]];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_edge_part(REF_EDGE ref_edge, REF_INT edge,
                                 REF_INT *part) {
  REF_NODE ref_node = ref_edge_node(ref_edge);

  if (ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge)) <
      ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge))) {
    *part = ref_node_part(ref_node, ref_edge_e2n(ref_edge, 0, edge));
  } else {
    *part = ref_node_part(ref_node, ref_edge_e2n(ref_edge, 1, edge));
  }

  return REF_SUCCESS;
}